

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  bool bVar1;
  hash_t hashCode_00;
  uint uVar2;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
  **ppSVar3;
  int **ppiVar4;
  int bucket;
  hash_t hashCode;
  int i;
  EntryType *newEntries;
  int *newBuckets;
  uint local_24;
  int local_20;
  uint newBucketCount;
  int modIndex;
  int newSize;
  AutoDoResize autoDoResize;
  BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  autoDoResize.lock = (NoResizeLock *)this;
  AutoDoResize::AutoDoResize((AutoDoResize *)&modIndex,(NoResizeLock *)this);
  newBucketCount = DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>::GetNextSize(this->count);
  local_20 = 0x4b;
  local_24 = DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>::GetBucketSize
                       (newBucketCount,&local_20);
  newEntries = (EntryType *)0x0;
  _i = (SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
        *)0x0;
  if (local_24 == this->bucketCount) {
    _i = AllocateEntries(this,newBucketCount,true);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>>,Memory::Recycler>
              (_i,(long)(int)newBucketCount,&this->entries,(long)this->count);
    ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                        ((WriteBarrierPtr *)&this->entries);
    DeleteEntries(this,*ppSVar3,this->size);
    Memory::
    WriteBarrierPtr<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
    ::operator=(&this->entries,_i);
    this->size = newBucketCount;
    this->modFunctionIndex = local_20;
  }
  else {
    Allocate(this,(int **)&newEntries,(EntryType **)&i,local_24,newBucketCount);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>>,Memory::Recycler>
              (_i,(long)(int)newBucketCount,&this->entries,(long)this->count);
    this->modFunctionIndex = local_20;
    for (bucket = 0; bucket < this->count; bucket = bucket + 1) {
      bVar1 = IsFreeEntry(_i + bucket);
      if (!bVar1) {
        hashCode_00 = DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                      ::
                      GetHashCode<DefaultComparer<Memory::RecyclerWeakReference<Js::PropertyGuard>*>>
                                ((DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>>,JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                                  *)(_i + bucket));
        uVar2 = GetBucket(hashCode_00,local_24,this->modFunctionIndex);
        _i[bucket].
        super_DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
        .
        super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
        .
        super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
        .
        super_ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
        .next = *(int *)((long)&(newEntries->
                                super_DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                                ).
                                super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
                                .
                                super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
                                .
                                super_ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
                                .value.ptr + (long)(int)uVar2 * 4);
        *(int *)((long)&(newEntries->
                        super_DefaultHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                        ).
                        super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
                        .
                        super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
                        .
                        super_ValueEntryData<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>
                        .value.ptr + (long)(int)uVar2 * 4) = bucket;
      }
    }
    ppiVar4 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
    DeleteBuckets(this,*ppiVar4,this->bucketCount);
    ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SimpleHashedEntry__
                        ((WriteBarrierPtr *)&this->entries);
    DeleteEntries(this,*ppSVar3,this->size);
    if (this->stats != (Type)0x0) {
      DictionaryStats::Resize(this->stats,newBucketCount,newBucketCount - this->size);
    }
    Memory::WriteBarrierPtr<int>::operator=(&this->buckets,(int *)newEntries);
    Memory::
    WriteBarrierPtr<JsUtil::SimpleHashedEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::PropertyGuard>_>_>_>
    ::operator=(&this->entries,_i);
    this->bucketCount = local_24;
    this->size = newBucketCount;
  }
  AutoDoResize::~AutoDoResize((AutoDoResize *)&modIndex);
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }